

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O1

bool Js::Exception::RaiseIfScriptActive(ScriptContext *scriptContext,uint kind,PVOID returnAddress)

{
  code *pcVar1;
  bool bVar2;
  ThreadContext *this;
  undefined4 *puVar3;
  
  this = ThreadContext::GetContextForCurrentThread();
  if (this != (ThreadContext *)0x0) {
    if ((kind == 0) && (DAT_015b5fa8 == '\x01')) {
      bVar2 = ThreadContext::TestThreadContextFlag(this,ThreadContextFlagDisableFatalOnOOM);
      if (!bVar2) {
        OutOfMemory_unrecoverable_error();
      }
    }
    if (this->isScriptActive == true) {
      if (kind == 1) {
        JavascriptError::ThrowStackOverflowError(scriptContext,returnAddress);
      }
      if (kind == 0) {
        if (returnAddress != (PVOID)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar3 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Exception.cpp"
                                      ,0x1b,"(returnAddress == __null)",
                                      "should not have returnAddress passed in");
          if (!bVar2) goto LAB_00763a9a;
          *puVar3 = 0;
        }
        JavascriptError::ThrowOutOfMemoryError(scriptContext);
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Exception.cpp"
                                  ,0x22,"(false)","Invalid ExceptionKind");
      if (!bVar2) {
LAB_00763a9a:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  return false;
}

Assistant:

bool Exception::RaiseIfScriptActive(ScriptContext *scriptContext, unsigned kind, PVOID returnAddress)
    {
        ThreadContext *threadContext = ThreadContext::GetContextForCurrentThread();

        if (threadContext != nullptr)
        {
            if (kind == ExceptionKind_OutOfMemory &&
                CONFIG_FLAG(EnableFatalErrorOnOOM) && !threadContext->TestThreadContextFlag(ThreadContextFlagDisableFatalOnOOM))
            {
                OutOfMemory_unrecoverable_error();
            }

            if (threadContext->IsScriptActive())
            {
                switch (kind) {
                case ExceptionKind_OutOfMemory:
                    AssertMsg(returnAddress == NULL, "should not have returnAddress passed in");
                    JavascriptError::ThrowOutOfMemoryError(scriptContext);

                case ExceptionKind_StackOverflow:
                    JavascriptError::ThrowStackOverflowError(scriptContext, returnAddress);

                default:
                    AssertMsg(false, "Invalid ExceptionKind");
                }
            }
        }

        return false;
    }